

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O1

ktx_error_code_e ktxHashList_Create(ktxHashList **ppHl)

{
  ktx_error_code_e kVar1;
  ktxHashList *ppkVar2;
  
  ppkVar2 = (ktxHashList *)malloc(8);
  if (ppkVar2 == (ktxHashList *)0x0) {
    kVar1 = KTX_OUT_OF_MEMORY;
  }
  else {
    *ppkVar2 = (ktxHashList)0x0;
    *ppHl = ppkVar2;
    kVar1 = KTX_SUCCESS;
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxHashList_Create(ktxHashList** ppHl)
{
    ktxHashList* hl = (ktxHashList*)malloc(sizeof (ktxKVListEntry*));
    if (hl == NULL)
        return KTX_OUT_OF_MEMORY;

    ktxHashList_Construct(hl);
    *ppHl = hl;
    return KTX_SUCCESS;
}